

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall re2::BitState::ShouldVisit(BitState *this,int id,char *p)

{
  int iVar1;
  iterator pcVar2;
  char *pcVar3;
  bool bVar4;
  size_t n;
  char *p_local;
  int id_local;
  BitState *this_local;
  
  iVar1 = StringPiece::size(&this->text_);
  pcVar2 = StringPiece::begin(&this->text_);
  pcVar3 = p + ((long)(id * (iVar1 + 1)) - (long)pcVar2);
  bVar4 = (this->visited_[(ulong)pcVar3 >> 5] & 1 << ((byte)pcVar3 & 0x1f)) == 0;
  if (bVar4) {
    this->visited_[(ulong)pcVar3 >> 5] =
         1 << ((byte)pcVar3 & 0x1f) | this->visited_[(ulong)pcVar3 >> 5];
  }
  return bVar4;
}

Assistant:

bool BitState::ShouldVisit(int id, const char* p) {
  size_t n = id * (text_.size() + 1) + (p - text_.begin());
  if (visited_[n/VisitedBits] & (1 << (n & (VisitedBits-1))))
    return false;
  visited_[n/VisitedBits] |= 1 << (n & (VisitedBits-1));
  return true;
}